

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

void __thiscall
duckdb::DataTable::InitializeScanWithOffset
          (DataTable *this,DuckTransaction *transaction,TableScanState *state,
          vector<duckdb::StorageIndex,_true> *column_ids,idx_t start_row,idx_t end_row)

{
  RowGroupCollection *this_00;
  vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_> local_58;
  
  shared_ptr<duckdb::DataTableInfo,_true>::operator*(&this->info);
  DuckTransaction::SharedLockTable
            ((DuckTransaction *)&stack0xffffffffffffffc0,(DataTableInfo *)transaction);
  shared_ptr<duckdb::CheckpointLock,_true>::operator=
            (&state->checkpoint_lock,
             (shared_ptr<duckdb::CheckpointLock,_true> *)&stack0xffffffffffffffc0);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::vector
            (&local_58,
             &column_ids->super_vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>)
  ;
  TableScanState::Initialize
            (state,(vector<duckdb::StorageIndex,_true> *)&local_58,
             (optional_ptr<duckdb::ClientContext,_true>)0x0,
             (optional_ptr<duckdb::TableFilterSet,_true>)0x0,
             (optional_ptr<duckdb::SampleOptions,_true>)0x0);
  ::std::vector<duckdb::StorageIndex,_std::allocator<duckdb::StorageIndex>_>::~vector(&local_58);
  this_00 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->(&this->row_groups);
  RowGroupCollection::InitializeScanWithOffset
            (this_00,&state->table_state,column_ids,start_row,end_row);
  return;
}

Assistant:

void DataTable::InitializeScanWithOffset(DuckTransaction &transaction, TableScanState &state,
                                         const vector<StorageIndex> &column_ids, idx_t start_row, idx_t end_row) {
	state.checkpoint_lock = transaction.SharedLockTable(*info);
	state.Initialize(column_ids);
	row_groups->InitializeScanWithOffset(state.table_state, column_ids, start_row, end_row);
}